

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O3

int Fra_LcrNodesAreEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  if ((*(uint *)&pObj0->field_0x18 & 7) != 2) {
    __assert_fail("Aig_ObjIsCi(pObj0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraLcr.c"
                  ,0xd0,"int Fra_LcrNodesAreEqual(Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObj1->field_0x18 & 7) == 2) {
    lVar4 = *(long *)((long)(pObj0->field_5).pData + 0x40);
    uVar1 = *(uint *)(*(long *)(lVar4 + 0x18) + (long)(pObj0->field_0).pNext * 4);
    if (uVar1 != *(uint *)(*(long *)(lVar4 + 0x18) + (long)(pObj1->field_0).pNext * 4)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraLcr.c"
                    ,0xd9,"int Fra_LcrNodesAreEqual(Aig_Obj_t *, Aig_Obj_t *)");
    }
    if ((-1 < (int)uVar1) && ((int)uVar1 < *(int *)(*(long *)(lVar4 + 0x28) + 4))) {
      iVar2 = *(int *)(*(long *)(lVar4 + 0x20) + (long)(pObj0->field_0).pNext * 4);
      if (-1 < (long)iVar2) {
        lVar5 = *(long *)(*(long *)(*(long *)(*(long *)(lVar4 + 0x28) + 8) + (ulong)uVar1 * 8) +
                         0x18);
        uVar1 = *(uint *)(lVar5 + 4);
        if (iVar2 < (int)uVar1) {
          uVar3 = *(uint *)(*(long *)(lVar4 + 0x20) + (long)(pObj1->field_0).pNext * 4);
          if ((-1 < (long)(int)uVar3) && (uVar3 < uVar1)) {
            lVar4 = *(long *)(lVar5 + 8);
            return (int)((*(ulong *)(*(long *)(lVar4 + (long)(int)uVar3 * 8) + 8) ^
                         *(ulong *)(*(long *)(lVar4 + (long)iVar2 * 8) + 8)) < 2);
          }
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Aig_ObjIsCi(pObj1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraLcr.c"
                ,0xd1,"int Fra_LcrNodesAreEqual(Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

int Fra_LcrNodesAreEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Fra_Man_t * pTemp = (Fra_Man_t *)pObj0->pData;
    Fra_Lcr_t * pLcr = (Fra_Lcr_t *)pTemp->pBmc;
    Aig_Man_t * pFraig;
    Aig_Obj_t * pOut0, * pOut1;
    int nPart0, nPart1;
    assert( Aig_ObjIsCi(pObj0) );
    assert( Aig_ObjIsCi(pObj1) );
    // find the partition to which these nodes belong
    nPart0 = pLcr->pInToOutPart[(long)pObj0->pNext];
    nPart1 = pLcr->pInToOutPart[(long)pObj1->pNext];
    // if this is the result of refinement of the class created const-1 nodes
    // the nodes may end up in different partions - we assume them equivalent
    if ( nPart0 != nPart1 )
    {
        assert( 0 );
        return 1;
    }
    assert( nPart0 == nPart1 );
    pFraig = (Aig_Man_t *)Vec_PtrEntry( pLcr->vFraigs, nPart0 );
    // get the fraig outputs
    pOut0 = Aig_ManCo( pFraig, pLcr->pInToOutNum[(long)pObj0->pNext] );
    pOut1 = Aig_ManCo( pFraig, pLcr->pInToOutNum[(long)pObj1->pNext] );
    return Aig_ObjFanin0(pOut0) == Aig_ObjFanin0(pOut1);
}